

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void write_iteration_info(double mu,double p_rho,double eta,uint global_iteration)

{
  char filename [64];
  char info [131072];
  
  filename[0x30] = '\0';
  filename[0x31] = '\0';
  filename[0x32] = '\0';
  filename[0x33] = '\0';
  filename[0x34] = '\0';
  filename[0x35] = '\0';
  filename[0x36] = '\0';
  filename[0x37] = '\0';
  filename[0x38] = '\0';
  filename[0x39] = '\0';
  filename[0x3a] = '\0';
  filename[0x3b] = '\0';
  filename[0x3c] = '\0';
  filename[0x3d] = '\0';
  filename[0x3e] = '\0';
  filename[0x3f] = '\0';
  filename[0x20] = '\0';
  filename[0x21] = '\0';
  filename[0x22] = '\0';
  filename[0x23] = '\0';
  filename[0x24] = '\0';
  filename[0x25] = '\0';
  filename[0x26] = '\0';
  filename[0x27] = '\0';
  filename[0x28] = '\0';
  filename[0x29] = '\0';
  filename[0x2a] = '\0';
  filename[0x2b] = '\0';
  filename[0x2c] = '\0';
  filename[0x2d] = '\0';
  filename[0x2e] = '\0';
  filename[0x2f] = '\0';
  filename[0x10] = '\0';
  filename[0x11] = '\0';
  filename[0x12] = '\0';
  filename[0x13] = '\0';
  filename[0x14] = '\0';
  filename[0x15] = '\0';
  filename[0x16] = '\0';
  filename[0x17] = '\0';
  filename[0x18] = '\0';
  filename[0x19] = '\0';
  filename[0x1a] = '\0';
  filename[0x1b] = '\0';
  filename[0x1c] = '\0';
  filename[0x1d] = '\0';
  filename[0x1e] = '\0';
  filename[0x1f] = '\0';
  filename[0] = '\0';
  filename[1] = '\0';
  filename[2] = '\0';
  filename[3] = '\0';
  filename[4] = '\0';
  filename[5] = '\0';
  filename[6] = '\0';
  filename[7] = '\0';
  filename[8] = '\0';
  filename[9] = '\0';
  filename[10] = '\0';
  filename[0xb] = '\0';
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  snprintf(filename,0x40,"results/dat/%u/info",global_iteration);
  snprintf(info,0x20000,"mu value: %.le\np_rho value: %.le\neta value: %.le\n     ",SUB84(mu,0),
           p_rho,eta);
  rewrite_file(filename,info);
  return;
}

Assistant:

void write_iteration_info (double mu, double p_rho, double eta, unsigned global_iteration) {
  char filename[MAX_FILENAME_SIZE] = "";
  char info[MAX_BUFFER_SIZE];

  snprintf (filename, MAX_FILENAME_SIZE, "results/dat/%u/info", global_iteration);
  snprintf (info, MAX_BUFFER_SIZE, 
    "mu value: %.le\n\
p_rho value: %.le\n\
eta value: %.le\n\
     ",
     mu,
     p_rho,
     eta);

  rewrite_file (filename, info);
}